

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_TryEmplaceWithHintWorks_Test::TestBody
          (Btree_TryEmplaceWithHintWorks_Test *this)

{
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  bVar1;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  bVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  byte bVar5;
  _Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  _Var6;
  _Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
  _Var7;
  Type TVar8;
  node_type *pnVar9;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  _Var10;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar12;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *right;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar13;
  node_type *pnVar14;
  node_type *pnVar15;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  node_type nVar22;
  int iVar23;
  uint uVar24;
  allocator_type *alloc;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  in_R9;
  uint uVar25;
  pointer *__ptr;
  undefined1 right_00 [8];
  node_type *pnVar26;
  bool bVar27;
  iterator iVar28;
  iterator iVar29;
  iterator iVar30;
  iterator iVar31;
  const_iterator hint;
  iterator iter;
  iterator iter_00;
  const_iterator hint_00;
  const_iterator hint_01;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int calls;
  btree_map<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>_>
  m;
  pair<int,_int> pair1024;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  undefined1 local_a0 [8];
  uint uStack_98;
  undefined4 uStack_94;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int local_80;
  node_type local_79;
  btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  local_78;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  local_58;
  _Head_base<0UL,_const_int_&,_false> local_48;
  undefined8 local_3c;
  uint local_34;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var11;
  
  local_78.root_.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
  ._M_head_impl.calls = (type)&local_80;
  local_80 = 0;
  local_78.root_.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )&btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
          ::EmptyNode()::empty_node;
  local_78.rightmost_ =
       (node_type *)
       &btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
        ::EmptyNode()::empty_node;
  local_78.size_ = 0;
  iVar23 = 0;
  do {
    local_b8._4_4_ = iVar23;
    local_b8._0_4_ = iVar23;
    btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
    ::insert_unique<std::pair<int,int>>
              ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
                *)local_a0,
               (btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                *)&local_78,(key_type *)local_b8,(pair<int,_int> *)local_b8);
    iVar23 = iVar23 + 1;
  } while (iVar23 != 0x80);
  local_80 = 0;
  local_b8 = (undefined1  [8])0x7f0000007f;
  btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
  ::insert_unique<std::pair<int,int>>
            ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)local_a0,
             (btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
              *)&local_78,(key_type *)local_b8,(pair<int,_int> *)local_b8);
  local_b8._0_4_ = 4;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)local_a0,"calls","4",&local_80,(int *)local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x884,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,uStack_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,uStack_98));
  }
  local_80 = 0;
  if (((ulong)local_78.root_.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
              ._M_head_impl & 7) == 0) {
    local_a0._0_4_ = 0xffffffff;
    local_b8._0_4_ = 0xffffffff;
    hint._8_8_ = 0;
    hint.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 *)*(ulong *)local_78.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                             ._M_head_impl;
    iVar28 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                 *)&local_78,hint,(key_type *)local_a0,(int *)local_b8);
    local_58.node = iVar28.node;
    local_58.position = iVar28.position;
    local_c0.data_._0_4_ = 0x81;
    local_b8 = (undefined1  [8])local_78.size_;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_a0,"129","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x889,pcVar18);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_94,uStack_98) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_94,uStack_98));
    }
    if (((ulong)local_78.root_.
                super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                ._M_head_impl & 7) == 0) {
      local_b8 = *(undefined1 (*) [8])
                  local_78.root_.
                  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                  ._M_head_impl;
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)pbStack_b0 & 0xffffffff00000000);
      testing::internal::EqHelper::
      Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
                (local_a0,"m.begin()",&local_58,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x88a,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      local_b8._0_4_ = 2;
      testing::internal::CmpHelperLE<int,int>
                ((internal *)local_a0,"calls","2",&local_80,(int *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x88b,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      _Var10._M_head_impl = local_78.rightmost_;
      _Var7._M_head_impl.calls =
           local_78.root_.
           super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
           .
           super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
           ._M_head_impl.calls;
      local_80 = 0;
      local_3c._0_4_ = 0x400;
      local_3c._4_4_ = 0x400;
      if (((ulong)local_78.rightmost_ & 7) == 0) {
        local_48._M_head_impl = (int *)((long)&local_3c + 4);
        nVar22 = *(node_type *)((long)local_78.rightmost_ + 10);
        local_c0.data_ = (AssertHelperData *)&local_3c;
        local_a0._0_4_ = SUB84(local_78.rightmost_,0);
        local_a0._4_4_ = (undefined4)((ulong)local_78.rightmost_ >> 0x20);
        uVar25 = (uint)(byte)nVar22;
        uStack_98 = uVar25;
        if ((node_type *)local_78.size_ == (node_type *)0x0) {
LAB_001d9a4d:
          in_R9._M_head_impl =
               (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                *)local_78.root_.
                  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
          ;
          if ((node_type *)local_78.size_ == (node_type *)0x0) {
            in_R9._M_head_impl =
                 btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::new_leaf_root_node(&local_78,1);
            local_78.root_.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
            .
            super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
            .
            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
            .
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
            ._M_head_impl =
                 (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  )(_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    )in_R9._M_head_impl;
            local_78.rightmost_ = in_R9._M_head_impl;
          }
          for (; _Var7._M_head_impl.calls =
                      local_78.root_.
                      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                      ._M_head_impl.calls, ((ulong)in_R9._M_head_impl & 7) == 0;
              in_R9._M_head_impl =
                   btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   ::child(in_R9._M_head_impl,(long)(int)uVar20)) {
            uVar25 = (uint)(byte)in_R9._M_head_impl[10];
            uVar20 = 0;
            if (in_R9._M_head_impl[10] !=
                (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 )0x0) {
              do {
                uVar24 = (int)(uVar25 + (int)uVar20) >> 1;
                if (*(int *)(in_R9._M_head_impl + (long)(int)uVar24 * 8 + 0xc) < (int)(Type)local_3c
                   ) {
                  uVar20 = (ulong)(uVar24 + 1);
                  uVar24 = uVar25;
                }
                uVar25 = uVar24;
                *(int *)_Var7._M_head_impl.calls = *(int *)_Var7._M_head_impl.calls + 1;
              } while ((uint)uVar20 != uVar25);
            }
            if (in_R9._M_head_impl[0xb] !=
                (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 )0x0) {
              _Var10._M_head_impl = in_R9._M_head_impl;
              uVar17 = uVar20;
              if (in_R9._M_head_impl ==
                  (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   *)0x0) {
                __assert_fail("iter.node != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xc0b,
                              "static IterType phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::internal_last(IterType) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>, IterType = phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>]"
                             );
              }
              goto LAB_001d9ad6;
            }
          }
          goto LAB_001da9ac;
        }
        if (nVar22 == *(node_type *)((long)local_78.rightmost_ + 10)) {
LAB_001d9942:
          local_b8 = (undefined1  [8])_Var10._M_head_impl;
          pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_94,uVar25);
          if (((ulong)local_78.root_.
                      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                      ._M_head_impl & 7) != 0) goto LAB_001da9e2;
          if ((_Var10._M_head_impl !=
               (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                *)*(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   local_78.root_.
                   super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                   ._M_head_impl) || (uVar25 != 0)) {
            btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                          *)local_b8);
            if (((ulong)local_b8 & 7) != 0) {
LAB_001daa56:
              pcVar18 = 
              "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
              ;
              goto LAB_001da9c1;
            }
            iVar23 = *(int *)((node_type *)((long)local_b8 + 0xc) + (long)(int)(uint)pbStack_b0 * 8)
            ;
            TVar8 = (Type)local_3c;
            *(int *)local_78.root_.
                    super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                    ._M_head_impl.calls =
                 *(int *)local_78.root_.
                         super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                         .
                         super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                         ._M_head_impl.calls + 1;
            if ((int)TVar8 <= iVar23) goto LAB_001d9a4d;
          }
          iter.node._4_4_ = local_a0._4_4_;
          iter.node._0_4_ = local_a0._0_4_;
          iter.position = uStack_98;
          iter._12_4_ = 0;
          iVar29 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                   ::
                   internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                             ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                               *)&local_78,iter,(piecewise_construct_t *)&local_c0,
                              (tuple<const_int_&> *)&local_48,(tuple<int_&> *)in_R9._M_head_impl);
          auVar3 = iVar29._0_12_;
        }
        else {
          iVar23 = *(int *)((node_type *)((long)local_78.rightmost_ + 0xc) + (ulong)(byte)nVar22 * 8
                           );
          iVar19 = *(int *)local_78.root_.
                           super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                           .
                           super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                           ._M_head_impl.calls;
          *(int *)local_78.root_.
                  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                  ._M_head_impl.calls = iVar19 + 1;
          if (0x400 < iVar23) goto LAB_001d9942;
          iVar23 = *(int *)((node_type *)((long)_Var10._M_head_impl + 0xc) + (long)(int)uVar25 * 8);
          TVar8 = (Type)local_3c;
          *(int *)_Var7._M_head_impl.calls = iVar19 + 2;
          if ((int)TVar8 <= iVar23) goto LAB_001d9b3d;
          btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
          ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                        *)local_a0);
          if (((ulong)local_78.rightmost_ & 7) != 0) goto LAB_001da9ac;
          pnVar14 = (node_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
          if ((pnVar14 != local_78.rightmost_) || (uStack_98 != (byte)local_78.rightmost_[10])) {
            if ((local_a0._0_4_ & 7) == 0) {
              TVar8 = (Type)local_3c;
              iVar23 = *(int *)(pnVar14 + (long)(int)uStack_98 * 8 + 0xc);
              *(int *)local_78.root_.
                      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                      ._M_head_impl.calls =
                   *(int *)local_78.root_.
                           super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                           .
                           super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                           ._M_head_impl.calls + 1;
              if (iVar23 <= (int)TVar8) goto LAB_001d9a4d;
              goto LAB_001d9a2d;
            }
            goto LAB_001daa56;
          }
LAB_001d9a2d:
          iVar29.position = uStack_98;
          iVar29.node = pnVar14;
          iVar29._12_4_ = 0;
          iVar29 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                   ::
                   internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                             ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                               *)&local_78,iVar29,(piecewise_construct_t *)&local_c0,
                              (tuple<const_int_&> *)&local_48,(tuple<int_&> *)in_R9._M_head_impl);
          auVar3 = iVar29._0_12_;
        }
        goto LAB_001d9b3b;
      }
      goto LAB_001da9ac;
    }
  }
  goto LAB_001da9e2;
  while( true ) {
    if (uVar25 != (byte)_Var10._M_head_impl[10]) goto LAB_001d9b02;
    pnVar14 = *(node_type **)_Var10._M_head_impl;
    if (((ulong)pnVar14 & 7) != 0) goto LAB_001da9ac;
    pnVar26 = _Var10._M_head_impl + 8;
    uVar25 = (uint)(byte)*pnVar26;
    _Var10._M_head_impl = pnVar14;
    uVar17 = (ulong)(byte)*pnVar26;
    if (pnVar14[0xb] != (node_type)0x0) break;
LAB_001d9ad6:
    uVar25 = (uint)uVar17;
    if (((ulong)_Var10._M_head_impl & 7) != 0) goto LAB_001da9ac;
  }
  _Var10._M_head_impl = (node_type *)0x0;
LAB_001d9b02:
  if (_Var10._M_head_impl == (node_type *)0x0) {
LAB_001d9b21:
    iter_00._8_8_ = uVar20;
    iter_00.node = in_R9._M_head_impl;
    iVar29 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
             ::
             internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                       ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                         *)&local_78,iter_00,(piecewise_construct_t *)&local_c0,
                        (tuple<const_int_&> *)&local_48,(tuple<int_&> *)in_R9._M_head_impl);
    auVar3 = iVar29._0_12_;
LAB_001d9b3b:
    _Var10._M_head_impl = auVar3._0_8_;
    uVar25 = auVar3._8_4_;
  }
  else {
    TVar8 = (Type)local_3c;
    iVar23 = *(int *)(_Var10._M_head_impl + (long)(int)uVar25 * 8 + 0xc);
    *(int *)local_78.root_.
            super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
            .
            super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
            ._M_head_impl.calls =
         *(int *)local_78.root_.
                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                 .
                 super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                 ._M_head_impl.calls + 1;
    if ((int)TVar8 < iVar23) goto LAB_001d9b21;
  }
LAB_001d9b3d:
  local_c0.data_._0_4_ = 0x82;
  local_b8 = (undefined1  [8])local_78.size_;
  local_58.node = _Var10._M_head_impl;
  local_58.position = uVar25;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_a0,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x891,pcVar18);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,uStack_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,uStack_98));
  }
  if (((ulong)local_78.rightmost_ & 7) == 0) {
    local_b8 = (undefined1  [8])local_78.rightmost_;
    pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(pbStack_b0._4_4_,
                          (uint)(byte)*(node_type *)((long)local_78.rightmost_ + 10));
    btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
    ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
    testing::internal::EqHelper::
    Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
              (local_a0,"--m.end()",&local_58,
               (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                *)local_b8);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x892,pcVar18);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_94,uStack_98) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_94,uStack_98));
    }
    local_b8._0_4_ = 2;
    testing::internal::CmpHelperLE<int,int>
              ((internal *)local_a0,"calls","2",&local_80,(int *)local_b8);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_b8);
      if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x893,pcVar18);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_94,uStack_98) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_94,uStack_98));
    }
    local_80 = 0;
    if (((ulong)local_78.rightmost_ & 7) == 0) {
      local_a0._0_4_ = 0x10;
      local_b8._0_4_ = 0x11;
      hint_00.position._0_1_ = local_78.rightmost_[10];
      hint_00.node = local_78.rightmost_;
      hint_00._9_7_ = 0;
      iVar28 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                   *)&local_78,hint_00,(key_type *)local_a0,(int *)local_b8);
      local_58.node = iVar28.node;
      local_58.position = iVar28.position;
      local_c0.data_._0_4_ = 0x82;
      local_b8 = (undefined1  [8])local_78.size_;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)local_a0,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x898,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      local_b8._0_4_ = 4;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)local_a0,"calls","4",&local_80,(int *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x899,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      local_c0.data_._0_4_ = 0x10;
      iVar30 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&local_78,(key_arg<int> *)&local_c0);
      local_b8 = (undefined1  [8])iVar30.node;
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(pbStack_b0._4_4_,iVar30.position);
      testing::internal::EqHelper::
      Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
                (local_a0,"m.find(16)",&local_58,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x89a,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      local_80 = 0;
      hint_01.position = local_58.position;
      hint_01.node = local_58.node;
      local_a0._0_4_ = 0x10;
      local_b8._0_4_ = 0x11;
      hint_01._12_4_ = 0;
      iVar28 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                   *)&local_78,hint_01,(key_type *)local_a0,(int *)local_b8);
      local_58.node = iVar28.node;
      local_58.position = iVar28.position;
      local_c0.data_._0_4_ = 0x82;
      local_b8 = (undefined1  [8])local_78.size_;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)local_a0,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x89f,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      local_b8._0_4_ = 2;
      testing::internal::CmpHelperLE<int,int>
                ((internal *)local_a0,"calls","2",&local_80,(int *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x8a0,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      local_c0.data_._0_4_ = 0x10;
      iVar30 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&local_78,(key_arg<int> *)&local_c0);
      local_b8 = (undefined1  [8])iVar30.node;
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(pbStack_b0._4_4_,iVar30.position);
      testing::internal::EqHelper::
      Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
                (local_a0,"m.find(16)",&local_58,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  *)local_b8);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b8);
        if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x8a1,pcVar18);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b8 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,uStack_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&uStack_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,uStack_98));
      }
      local_c0.data_._0_4_ = 2;
      iVar31 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::internal_find<int>(&local_78,(int *)&local_c0);
      _Var11._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )iVar31.node;
      if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )_Var11._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
LAB_001da56f:
        local_c0.data_._0_4_ = 0x81;
        local_b8 = (undefined1  [8])local_78.size_;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_a0,"129","m.size()",(int *)&local_c0,(unsigned_long *)local_b8)
        ;
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_b8);
          if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x8a4,pcVar18);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_b8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_94,uStack_98) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&uStack_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_94,uStack_98));
        }
        local_a0._0_4_ = 3;
        iVar30 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                              *)&local_78,(key_arg<int> *)local_a0);
        local_80 = 0;
        local_a0._0_4_ = 2;
        local_b8._0_4_ = 2;
        btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&local_78,(const_iterator)iVar30,(key_type *)local_a0,(int *)local_b8)
        ;
        local_c0.data_._0_4_ = 0x82;
        local_b8 = (undefined1  [8])local_78.size_;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_a0,"130","m.size()",(int *)&local_c0,(unsigned_long *)local_b8)
        ;
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_b8);
          if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x8a9,pcVar18);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_b8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_94,uStack_98) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&uStack_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_94,uStack_98));
        }
        local_b8._0_4_ = 2;
        testing::internal::CmpHelperLE<int,int>
                  ((internal *)local_a0,"calls","2",&local_80,(int *)local_b8);
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_b8);
          if ((undefined8 *)CONCAT44(uStack_94,uStack_98) == (undefined8 *)0x0) {
            pcVar18 = "";
          }
          else {
            pcVar18 = *(char **)CONCAT44(uStack_94,uStack_98);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x8aa,pcVar18);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_b8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_94,uStack_98) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&uStack_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_94,uStack_98));
        }
        pnVar14 = local_78.rightmost_;
        if (((ulong)local_78.root_.
                    super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                    .
                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                    ._M_head_impl & 7) != 0) {
LAB_001da9e2:
          pcVar18 = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_001da9c1;
        }
        if (((ulong)local_78.rightmost_ & 7) == 0) {
          pnVar26 = *(node_type **)
                     local_78.root_.
                     super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                     ._M_head_impl;
          uVar25 = (uint)(byte)local_78.rightmost_[10];
          if (local_78.rightmost_[10] == (node_type)0x0 && pnVar26 == local_78.rightmost_) {
            local_a0._0_4_ = SUB84(local_78.rightmost_,0);
            local_a0._4_4_ = (undefined4)((ulong)local_78.rightmost_ >> 0x20);
            uStack_98 = uVar25;
          }
          else {
            local_a0._0_4_ = SUB84(pnVar26,0);
            local_a0._4_4_ = (undefined4)((ulong)pnVar26 >> 0x20);
            uStack_98 = 0;
            btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                          *)local_a0);
            if (uStack_98 != uVar25 ||
                (node_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != pnVar14) {
              pnVar9 = (node_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
              uVar24 = 0;
              do {
                pnVar15 = pnVar9;
                uVar16 = uStack_98;
                if ((((ulong)pnVar15 & 7) != 0) || (((ulong)pnVar26 & 7) != 0)) {
                  pcVar18 = 
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                  ;
                  goto LAB_001da9c1;
                }
                if ((*(int *)(pnVar15 + (long)(int)uStack_98 * 8 + 0xc) <
                     *(int *)(pnVar26 + (long)(int)uVar24 * 8 + 0xc)) ||
                   ((*(int *)(pnVar15 + (long)(int)uStack_98 * 8 + 0xc) <=
                     *(int *)(pnVar26 + (long)(int)uVar24 * 8 + 0xc) &&
                    (*(int *)(pnVar15 + (long)(int)uStack_98 * 8 + 0x10) <
                     *(int *)(pnVar26 + (long)(int)uVar24 * 8 + 0x10))))) break;
                btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                              *)local_a0);
                pnVar9 = (node_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
                pnVar26 = pnVar15;
                uVar24 = uVar16;
              } while (uStack_98 != uVar25 ||
                       (node_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != pnVar14);
            }
          }
          bVar27 = (node_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_) == pnVar14;
          local_b8[0] = uStack_98 == uVar25 && bVar27;
          pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (uStack_98 != uVar25 || !bVar27) {
            testing::Message::Message((Message *)&local_c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)local_b8,
                       (AssertionResult *)"std::is_sorted(m.begin(), m.end())","false","true",
                       (char *)in_R9._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_48,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                       ,0x8ac,(char *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_48,(Message *)&local_c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != &local_90) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                              local_90._M_allocated_capacity + 1);
            }
            if (local_c0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_c0.data_ + 8))();
            }
          }
          if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_b0,pbStack_b0);
          }
          if ((node_type *)local_78.size_ != (node_type *)0x0) {
            btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::internal_clear(&local_78,
                             (node_type *)
                             local_78.root_.
                             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                             .
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                             ._M_head_impl);
          }
          return;
        }
      }
      else {
        pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(pbStack_b0._4_4_,iVar31.position);
        local_b8 = (undefined1  [8])
                   _Var11._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
        if (((undefined1  [16])iVar31 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
          nVar22 = *(node_type *)
                    ((long)_Var11._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0xb);
          if (nVar22 == (node_type)0x0) {
            btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                          *)local_b8);
            if (((ulong)local_b8 & 7) != 0) goto LAB_001da9ac;
            if (*(node_type *)((long)local_b8 + 0xb) == (node_type)0x0) {
              __assert_fail("iter.node->leaf()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xa7e,
                            "iterator phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::erase(iterator) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                           );
            }
            lVar21 = (long)iVar31.position;
            iVar31._8_8_ = lVar21;
            iVar31.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           *)local_b8;
            *(undefined4 *)
             ((node_type *)
              ((long)_Var11._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 0xc) + lVar21 * 8) =
                 *(undefined4 *)
                  ((node_type *)((long)local_b8 + 0xc) + (long)(int)(uint)pbStack_b0 * 8);
            *(undefined4 *)
             ((node_type *)
              ((long)_Var11._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 0x10) + lVar21 * 8) =
                 *(undefined4 *)
                  ((node_type *)((long)local_b8 + 0x10) + (long)(int)(uint)pbStack_b0 * 8);
          }
          local_b8 = (undefined1  [8])iVar31.node;
          local_79 = nVar22;
          btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::remove_value((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                          *)local_b8,(uint)pbStack_b0,iVar31._8_8_);
          local_78.size_ = local_78.size_ + -1;
          local_a0._0_4_ = local_b8._0_4_;
          local_a0._4_4_ = local_b8._4_4_;
          uStack_98 = (uint)pbStack_b0;
          local_34 = (uint)CONCAT71((int7)((ulong)&local_78 >> 8),1);
          right_00 = local_b8;
          uVar25 = (uint)pbStack_b0;
          while ((_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  )right_00 !=
                 (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                  )local_78.root_.
                   super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                   ._M_head_impl) {
            if (((ulong)right_00 & 7) != 0) goto LAB_001da9ac;
            if (0xe < (byte)*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                              *)((long)right_00 + 10)) goto LAB_001da525;
            pbVar13 = *(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        **)right_00;
            if ((ulong)(byte)*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                               *)((long)right_00 + 8) == 0) {
LAB_001da311:
              if (((ulong)pbVar13 & 7) != 0) goto LAB_001da9ac;
              bVar27 = true;
              pbVar12 = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         *)right_00;
              if ((byte)*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                          *)((long)right_00 + 8) < (byte)pbVar13[10]) {
                right = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        ::child(pbVar13,(ulong)(byte)*(
                                                  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                                  *)((long)right_00 + 8) + 1);
                if (((ulong)right & 7) != 0) goto LAB_001da9ac;
                if ((right[0xb] !=
                     (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      )0x0) &&
                   (right[0xb] !=
                    (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     )0x1e)) {
                  __assert_fail("right->max_count() == kNodeValues",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0xbd0,
                                "bool phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                               );
                }
                bVar1 = *(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                          *)((long)right_00 + 10);
                bVar2 = right[10];
                if ((uint)(byte)bVar1 + (uint)(byte)bVar2 + 1 < 0x1f) {
                  btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::merge_nodes(&local_78,(node_type *)right_00,right);
                  bVar27 = true;
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                  if ((byte)bVar2 < 0x10) {
                    bVar27 = true;
                  }
                  else if ((bVar1 == (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                      )0x0) || (bVar27 = true, 0 < (int)uVar25)) {
                    iVar19 = (int)((uint)(byte)bVar2 - (uint)(byte)bVar1) / 2;
                    iVar23 = (byte)bVar2 - 1;
                    if (iVar19 <= (int)((byte)bVar2 - 1)) {
                      iVar23 = iVar19;
                    }
                    btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::rebalance_right_to_left
                              ((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                *)right_00,iVar23,right,
                               (allocator_type *)(ulong)((uint)(byte)bVar2 - (uint)(byte)bVar1));
                    bVar4 = false;
                    bVar27 = false;
                  }
                }
                if (!bVar4) goto LAB_001da43f;
              }
              if ((ulong)(byte)*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                 *)((long)right_00 + 8) == 0) {
                bVar27 = false;
              }
              else {
                pbVar13 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                          ::child(pbVar13,(ulong)(byte)*(
                                                  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                                  *)((long)right_00 + 8) - 1);
                if (((ulong)pbVar13 & 7) != 0) goto LAB_001da9ac;
                bVar1 = pbVar13[10];
                if (((byte)bVar1 < 0x10) ||
                   ((bVar2 = *(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                               *)((long)right_00 + 10),
                    bVar2 != (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                              )0x0 && ((int)(uint)(byte)bVar2 <= (int)uVar25)))) {
                  bVar5 = 0;
                }
                else {
                  uVar16 = (int)((uint)(byte)bVar1 - (uint)(byte)bVar2) / 2;
                  uVar24 = (byte)bVar1 - 1;
                  if ((int)uVar16 <= (int)((byte)bVar1 - 1)) {
                    uVar24 = uVar16;
                  }
                  btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::rebalance_left_to_right
                            (pbVar13,uVar24,
                             (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                              *)right_00,(allocator_type *)(ulong)uVar16);
                  uVar25 = uVar25 + uVar24;
                  bVar5 = 1;
                  bVar27 = false;
                }
                bVar27 = (bool)(bVar27 & bVar5);
              }
            }
            else {
              pbVar12 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        ::child(pbVar13,(ulong)(byte)*(
                                                  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                                  *)((long)right_00 + 8) - 1);
              if (((ulong)pbVar12 & 7) != 0) goto LAB_001da9ac;
              if ((pbVar12[0xb] !=
                   (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    )0x0) &&
                 (pbVar12[0xb] !=
                  (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   )0x1e)) {
                __assert_fail("left->max_count() == kNodeValues",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xbc5,
                              "bool phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                             );
              }
              bVar1 = pbVar12[10];
              if (0x1e < (uint)(byte)*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                       *)((long)right_00 + 10) + (uint)(byte)bVar1 + 1)
              goto LAB_001da311;
              btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::merge_nodes(&local_78,pbVar12,(node_type *)right_00);
              uVar25 = (byte)bVar1 + 1 + uVar25;
              bVar27 = true;
            }
LAB_001da43f:
            if ((local_34 & 1) != 0) {
              local_a0._0_4_ = SUB84(pbVar12,0);
              local_a0._4_4_ = (undefined4)((ulong)pbVar12 >> 0x20);
              local_34 = 0;
              uStack_98 = uVar25;
            }
            if (!bVar27) goto LAB_001da525;
            uVar25 = (uint)(byte)pbVar12[8];
            right_00 = *(undefined1 (*) [8])pbVar12;
          }
          if (((ulong)local_78.root_.
                      super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      .
                      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                      ._M_head_impl & 7) == 0) {
            if (*(node_type *)
                 ((long)local_78.root_.
                        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                        ._M_head_impl + 10) == (node_type)0x0) {
              if (*(node_type *)
                   ((long)local_78.root_.
                          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                          ._M_head_impl + 0xb) != (node_type)0x0) {
                if ((node_type *)local_78.size_ != (node_type *)0x0) {
                  __assert_fail("size() == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0xbfc,
                                "void phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_shrink() [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                               );
                }
                btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::delete_leaf_node(&local_78,
                                   (node_type *)
                                   local_78.root_.
                                   super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                   .
                                   super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                   .
                                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                   .
                                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                   ._M_head_impl);
                local_78.root_.
                super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                ._M_head_impl =
                     (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      )&btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                        ::EmptyNode()::empty_node;
                local_78.rightmost_ =
                     (node_type *)
                     &btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
                      ::EmptyNode()::empty_node;
                goto LAB_001da519;
              }
              alloc = (allocator_type *)0x0;
              pbVar13 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        ::child((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                 *)local_78.root_.
                                   super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                   .
                                   super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                   .
                                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                   .
                                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                   ._M_head_impl,0);
              if (((ulong)pbVar13 & 7) == 0) {
                bVar27 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         ::is_root(*(btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                                     **)pbVar13);
                _Var6.
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                ._M_head_impl =
                     (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                      )(_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        )local_78.root_.
                         super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                         .
                         super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                ;
                if (!bVar27) {
                  __assert_fail("parent()->is_root()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x4ad,
                                "void phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::make_root() [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                               );
                }
                if (((ulong)*(undefined8 **)pbVar13 & 7) == 0) {
                  *(undefined8 *)pbVar13 = **(undefined8 **)pbVar13;
                  btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::destroy((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                             *)local_78.root_.
                               super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                               .
                               super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                               .
                               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                               .
                               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                               ._M_head_impl,alloc);
                  operator_delete((void *)_Var6.
                                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                          .
                                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                          ._M_head_impl,0x1f8);
                  local_78.root_.
                  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                  .
                  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                  ._M_head_impl =
                       (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        )(_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          )pbVar13;
                  goto LAB_001da519;
                }
              }
              goto LAB_001da9e2;
            }
LAB_001da519:
            if ((node_type *)local_78.size_ == (node_type *)0x0) {
              if (((ulong)local_78.rightmost_ & 7) == 0) {
                uStack_98 = (uint)(byte)local_78.rightmost_[10];
                pnVar14 = local_78.rightmost_;
                nVar22 = local_79;
LAB_001da558:
                local_a0._0_4_ = SUB84(pnVar14,0);
                local_a0._4_4_ = (undefined4)((ulong)pnVar14 >> 0x20);
                if (nVar22 == (node_type)0x0) {
                  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                                *)local_a0);
                }
                goto LAB_001da56f;
              }
            }
            else {
LAB_001da525:
              nVar22 = local_79;
              if ((local_a0._0_4_ & 7) == 0) {
                uVar25 = (uint)*(byte *)(CONCAT44(local_a0._4_4_,local_a0._0_4_) + 10);
                if (uStack_98 == uVar25) {
                  uStack_98 = uVar25 - 1;
                  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                  ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                                *)local_a0);
                }
                pnVar14 = (node_type *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
                goto LAB_001da558;
              }
            }
          }
        }
      }
    }
  }
LAB_001da9ac:
  pcVar18 = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_001da9c1:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,pcVar18);
}

Assistant:

TEST(Btree, TryEmplaceWithHintWorks) {
        // Use a counting comparator here to verify that hint is used.
        int calls = 0;
        auto cmp = [&calls](int x, int y) {
            ++calls;
            return x < y;
        };
        using Cmp = decltype(cmp);

        phmap::btree_map<int, int, Cmp> m(cmp);
        for (int i = 0; i < 128; ++i) {
            m.emplace(i, i);
        }

        // Sanity check for the comparator
        calls = 0;
        m.emplace(127, 127);
        EXPECT_GE(calls, 4);

        // Try with begin hint:
        calls = 0;
        auto it = m.try_emplace(m.begin(), -1, -1);
        EXPECT_EQ(129, m.size());
        EXPECT_EQ(it, m.begin());
        EXPECT_LE(calls, 2);

        // Try with end hint:
        calls = 0;
        std::pair<int, int> pair1024 = {1024, 1024};
        it = m.try_emplace(m.end(), pair1024.first, pair1024.second);
        EXPECT_EQ(130, m.size());
        EXPECT_EQ(it, --m.end());
        EXPECT_LE(calls, 2);

        // Try value already present, bad hint; ensure no duplicate added:
        calls = 0;
        it = m.try_emplace(m.end(), 16, 17);
        EXPECT_EQ(130, m.size());
        EXPECT_GE(calls, 4);
        EXPECT_EQ(it, m.find(16));

        // Try value already present, hint points directly to it:
        calls = 0;
        it = m.try_emplace(it, 16, 17);
        EXPECT_EQ(130, m.size());
        EXPECT_LE(calls, 2);
        EXPECT_EQ(it, m.find(16));

        m.erase(2);
        EXPECT_EQ(129, m.size());
        auto hint = m.find(3);
        // Try emplace in the middle of two other elements.
        calls = 0;
        m.try_emplace(hint, 2, 2);
        EXPECT_EQ(130, m.size());
        EXPECT_LE(calls, 2);

        EXPECT_TRUE(std::is_sorted(m.begin(), m.end()));
    }